

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void Am_Error(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cerr,"**  Program aborted.");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void
Am_Error()
{
#ifdef DEBUG
  if (Am_Debugger)
    Am_Debugger();
#endif

  std::cerr << "**  Program aborted." << std::endl;
#if defined(_WIN32)
  std::cerr << "(press return to exit)" << std::endl;
  getchar();
#endif
  abort();
}